

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cms_test.cc
# Opt level: O0

int test_delete_metric_stream(void)

{
  code *pcVar1;
  char *__s;
  CmsDeleteMetricStreamRequestType *pCVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1a9;
  int ret;
  HttpTestListener *local_188;
  HttpTestListener *listener;
  string local_178;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [55];
  allocator<char> local_f1;
  string local_f0 [32];
  CmsDeleteMetricStreamRequestType *local_d0;
  Cms *cms;
  CmsDeleteMetricStreamResponseType resp;
  CmsDeleteMetricStreamRequestType req;
  
  aliyun::CmsDeleteMetricStreamRequestType::CmsDeleteMetricStreamRequestType
            ((CmsDeleteMetricStreamRequestType *)((long)&resp.trace_id.field_2 + 8));
  aliyun::CmsDeleteMetricStreamResponseType::CmsDeleteMetricStreamResponseType
            ((CmsDeleteMetricStreamResponseType *)&cms);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"cn-hangzhou",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"my_appid",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"my_secret",&local_151);
  pCVar2 = (CmsDeleteMetricStreamRequestType *)
           aliyun::Cms::CreateCmsClient(local_f0,local_128,local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_d0 = pCVar2;
  if (pCVar2 == (CmsDeleteMetricStreamRequestType *)0x0) {
    aliyun::CmsDeleteMetricStreamResponseType::~CmsDeleteMetricStreamResponseType
              ((CmsDeleteMetricStreamResponseType *)&cms);
    aliyun::CmsDeleteMetricStreamRequestType::~CmsDeleteMetricStreamRequestType
              ((CmsDeleteMetricStreamRequestType *)((long)&resp.trace_id.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Cms::SetProxyHost((Cms *)pCVar2,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Cms::SetUseTls((Cms *)local_d0,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_delete_metric_stream_response;
  local_188 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1a9);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1a9);
  HttpTestListener::Start(local_188);
  std::__cxx11::string::operator=((string *)(resp.trace_id.field_2._M_local_buf + 8),"ProjectName");
  std::__cxx11::string::operator=
            ((string *)(req.project_name.field_2._M_local_buf + 8),"MetricStreamName");
  aliyun::Cms::DeleteMetricStream
            (local_d0,(CmsDeleteMetricStreamResponseType *)((long)&resp.trace_id.field_2 + 8),
             (CmsErrorInfo *)&cms);
  HttpTestListener::WaitComplete(local_188);
  pHVar3 = local_188;
  if (local_188 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_188);
    operator_delete(pHVar3,0x180);
  }
  pCVar2 = local_d0;
  if (local_d0 != (CmsDeleteMetricStreamRequestType *)0x0) {
    aliyun::Cms::~Cms((Cms *)local_d0);
    operator_delete(pCVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_delete_metric_stream() {
  CmsDeleteMetricStreamRequestType req;
  CmsDeleteMetricStreamResponseType resp;
  Cms* cms = Cms::CreateCmsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!cms) return 0;
  cms->SetProxyHost("127.0.0.1:12234");
  cms->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_delete_metric_stream_response);
  listener->Start();
  req.project_name = "ProjectName";
  req.metric_stream_name = "MetricStreamName";
  int ret = cms->DeleteMetricStream(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete cms;
}